

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPublicKey.cpp
# Opt level: O0

void __thiscall OSSLEDPublicKey::createOSSLKey(OSSLEDPublicKey *this)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_t length;
  EVP_PKEY *pEVar4;
  ByteString *in_RDI;
  uchar *p;
  size_t len;
  ByteString raw;
  ByteString der;
  ByteString *in_stack_fffffffffffffee8;
  ByteString *in_stack_fffffffffffffef0;
  uchar *local_80;
  undefined4 local_74;
  size_t local_70;
  ByteString *byteString;
  
  if (in_RDI[2].byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    return;
  }
  byteString = in_RDI;
  ByteString::ByteString((ByteString *)0x130918);
  DERUTIL::octet2Raw(byteString);
  local_70 = ByteString::size((ByteString *)0x130940);
  if (local_70 == 0) {
    local_74 = 1;
    goto LAB_00130e3a;
  }
  iVar1 = *(int *)&in_RDI[2].byteString.
                   super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                   super__Tp_alloc_type._vptr_SecureAllocator;
  if (iVar1 == 0x40a) {
    if (local_70 != 0x20) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0xd7,"Invalid size. Expected: %lu, Actual: %lu",0x20,local_70);
      local_74 = 1;
      goto LAB_00130e3a;
    }
    ByteString::resize(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    builtin_memcpy(puVar2,"0*0\x05\x06\x03+en\x03!",0xc);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar3 = ByteString::const_byte_str(in_stack_fffffffffffffee8);
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 8) = *(undefined8 *)(puVar3 + 8);
    *(undefined8 *)(puVar2 + 0x10) = *(undefined8 *)(puVar3 + 0x10);
    *(undefined8 *)(puVar2 + 0x18) = *(undefined8 *)(puVar3 + 0x18);
  }
  else if (iVar1 == 0x40b) {
    if (local_70 != 0x38) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0xeb,"Invalid size. Expected: %lu, Actual: %lu",0x38,local_70);
      local_74 = 1;
      goto LAB_00130e3a;
    }
    ByteString::resize(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    builtin_memcpy(puVar2,"0B0\x05\x06\x03+eo\x039",0xc);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar3 = ByteString::const_byte_str(in_stack_fffffffffffffee8);
    memcpy(puVar2,puVar3,0x38);
  }
  else if (iVar1 == 0x43f) {
    if (local_70 != 0x20) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0xe1,"Invalid size. Expected: %lu, Actual: %lu",0x20,local_70);
      local_74 = 1;
      goto LAB_00130e3a;
    }
    ByteString::resize(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    builtin_memcpy(puVar2,"0*0\x05\x06\x03+ep\x03!",0xc);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar3 = ByteString::const_byte_str(in_stack_fffffffffffffee8);
    *(undefined8 *)puVar2 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar2 + 8) = *(undefined8 *)(puVar3 + 8);
    *(undefined8 *)(puVar2 + 0x10) = *(undefined8 *)(puVar3 + 0x10);
    *(undefined8 *)(puVar2 + 0x18) = *(undefined8 *)(puVar3 + 0x18);
  }
  else {
    if (iVar1 != 0x440) {
      local_74 = 1;
      goto LAB_00130e3a;
    }
    if (local_70 != 0x39) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDPublicKey.cpp"
                 ,0xf5,"Invalid size. Expected: %lu, Actual: %lu",0x39,local_70);
      local_74 = 1;
      goto LAB_00130e3a;
    }
    ByteString::resize(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    builtin_memcpy(puVar2,"0C0\x05\x06\x03+eq\x03:",0xc);
    puVar2 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    puVar3 = ByteString::const_byte_str(in_stack_fffffffffffffee8);
    memcpy(puVar2,puVar3,0x39);
  }
  local_80 = ByteString::operator[](in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
  length = ByteString::size((ByteString *)0x130dfa);
  pEVar4 = d2i_PUBKEY((EVP_PKEY **)0x0,&local_80,length);
  in_RDI[2].byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pEVar4;
  local_74 = 0;
LAB_00130e3a:
  ByteString::~ByteString((ByteString *)0x130e47);
  ByteString::~ByteString((ByteString *)0x130e54);
  return;
}

Assistant:

void OSSLEDPublicKey::createOSSLKey()
{
	if (pkey != NULL) return;

	ByteString der;
	ByteString raw = DERUTIL::octet2Raw(a);
	size_t len = raw.size();
	if (len == 0) return;

	switch (nid) {
	case NID_X25519:
		if (len != X25519_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X25519_KEYLEN);
		memcpy(&der[0], x25519_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X25519_KEYLEN);
		break;
	case NID_ED25519:
		if (len != X25519_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X25519_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X25519_KEYLEN);
		memcpy(&der[0], ed25519_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X25519_KEYLEN);
		break;
	case NID_X448:
		if (len != X448_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", X448_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + X448_KEYLEN);
		memcpy(&der[0], x448_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), X448_KEYLEN);
		break;
	case NID_ED448:
		if (len != ED448_KEYLEN)
		{
			ERROR_MSG("Invalid size. Expected: %lu, Actual: %lu", ED448_KEYLEN, len);
			return;
		}
		der.resize(PREFIXLEN + ED448_KEYLEN);
		memcpy(&der[0], ed448_prefix, PREFIXLEN);
		memcpy(&der[PREFIXLEN], raw.const_byte_str(), ED448_KEYLEN);
		break;
	default:
		return;
	}
	const unsigned char *p = &der[0];
	pkey = d2i_PUBKEY(NULL, &p, (long)der.size());
}